

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O3

bool google::ParseExprPrimary(State *state)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  undefined4 uVar6;
  undefined2 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  bool bVar10;
  char *pcVar11;
  long lVar12;
  char cVar13;
  State copy;
  
  pcVar1 = state->mangled_cur;
  pcVar2 = state->out_cur;
  pcVar3 = state->out_begin;
  pcVar4 = state->out_end;
  pcVar5 = state->prev_name;
  uVar6 = state->prev_name_length;
  uVar7 = state->nest_level;
  uVar8 = state->append;
  uVar9 = state->overflowed;
  if (*state->mangled_cur == 'L') {
    state->mangled_cur = state->mangled_cur + 1;
    bVar10 = ParseType(state);
    if (((!bVar10) || (bVar10 = ParseNumber(state,(int *)0x0), !bVar10)) ||
       (pcVar11 = state->mangled_cur, *pcVar11 != 'E')) goto LAB_001191f6;
LAB_001192ff:
    state->mangled_cur = pcVar11 + 1;
    bVar10 = true;
  }
  else {
LAB_001191f6:
    state->mangled_cur = pcVar1;
    state->out_cur = pcVar2;
    state->prev_name = pcVar5;
    state->prev_name_length = uVar6;
    state->nest_level = uVar7;
    state->append = (bool)uVar8;
    state->overflowed = (bool)uVar9;
    state->out_begin = pcVar3;
    state->out_end = pcVar4;
    if (*state->mangled_cur == 'L') {
      state->mangled_cur = state->mangled_cur + 1;
      bVar10 = ParseType(state);
      if (bVar10) {
        pcVar11 = state->mangled_cur;
        cVar13 = *pcVar11;
        if (cVar13 != '\0') {
          lVar12 = 0;
          do {
            if (9 < (byte)(cVar13 - 0x30U) && 5 < (byte)(cVar13 + 0x9fU)) {
              if (lVar12 == 0) goto LAB_0011926e;
              break;
            }
            cVar13 = pcVar11[lVar12 + 1];
            lVar12 = lVar12 + 1;
          } while (cVar13 != '\0');
          pcVar11 = pcVar11 + lVar12;
          state->mangled_cur = pcVar11;
          if (*pcVar11 == 'E') goto LAB_001192ff;
        }
      }
    }
LAB_0011926e:
    state->mangled_cur = pcVar1;
    state->out_cur = pcVar2;
    state->prev_name = pcVar5;
    state->prev_name_length = uVar6;
    state->nest_level = uVar7;
    state->append = (bool)uVar8;
    state->overflowed = (bool)uVar9;
    state->out_begin = pcVar3;
    state->out_end = pcVar4;
    pcVar11 = state->mangled_cur;
    if (((*pcVar11 == 'L') && (state->mangled_cur = pcVar11 + 1, pcVar11[1] == '_')) &&
       (pcVar11[2] == 'Z')) {
      state->mangled_cur = pcVar11 + 3;
      bVar10 = ParseEncoding(state);
      if ((bVar10) && (pcVar11 = state->mangled_cur, *pcVar11 == 'E')) goto LAB_001192ff;
    }
    state->mangled_cur = pcVar1;
    state->out_cur = pcVar2;
    state->prev_name = pcVar5;
    state->prev_name_length = uVar6;
    state->nest_level = uVar7;
    state->append = (bool)uVar8;
    state->overflowed = (bool)uVar9;
    state->out_begin = pcVar3;
    state->out_end = pcVar4;
    pcVar11 = state->mangled_cur;
    if ((*pcVar11 == 'L') && (pcVar11[1] == 'Z')) {
      state->mangled_cur = pcVar11 + 2;
      bVar10 = ParseEncoding(state);
      if ((bVar10) && (pcVar11 = state->mangled_cur, *pcVar11 == 'E')) goto LAB_001192ff;
    }
    state->prev_name = pcVar5;
    state->prev_name_length = uVar6;
    state->nest_level = uVar7;
    state->append = (bool)uVar8;
    state->overflowed = (bool)uVar9;
    state->out_begin = pcVar3;
    state->out_end = pcVar4;
    state->mangled_cur = pcVar1;
    state->out_cur = pcVar2;
    bVar10 = false;
  }
  return bVar10;
}

Assistant:

static bool ParseExprPrimary(State *state) {
  State copy = *state;
  if (ParseOneCharToken(state, 'L') && ParseType(state) &&
      ParseNumber(state, NULL) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  *state = copy;

  if (ParseOneCharToken(state, 'L') && ParseType(state) &&
      ParseFloatNumber(state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  *state = copy;

  if (ParseOneCharToken(state, 'L') && ParseMangledName(state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  *state = copy;

  if (ParseTwoCharToken(state, "LZ") && ParseEncoding(state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  *state = copy;

  return false;
}